

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O3

void __thiscall ClipperLib::PolyNode::~PolyNode(PolyNode *this)

{
  ~PolyNode(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~PolyNode(){}